

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_preprocessor.c
# Opt level: O2

void handle_pp_include(Context_conflict1 *ctx)

{
  char cVar1;
  IncludeState *state;
  MOJOSHADER_includeOpen p_Var2;
  MOJOSHADER_malloc p_Var3;
  MOJOSHADER_includeClose p_Var4;
  MOJOSHADER_free p_Var5;
  void *pvVar6;
  undefined8 uVar7;
  long lVar8;
  Token TVar9;
  int iVar10;
  uint uVar11;
  bool bVar12;
  char *__src;
  char *pcVar13;
  ulong __n;
  char *fname;
  MOJOSHADER_includeType MVar14;
  undefined8 auStack_60 [3];
  char acStack_48 [8];
  char *local_40;
  char *newdata;
  uint newbytes;
  
  state = ctx->include_stack;
  auStack_60[2] = 0x1295c3;
  TVar9 = lexer(state);
  if (TVar9 == 0x3c) {
    auStack_60[2] = 1;
    MVar14 = MOJOSHADER_INCLUDETYPE_SYSTEM;
    uVar11 = state->bytes_left;
    bVar12 = false;
    do {
      do {
        while( true ) {
          if (bVar12) goto LAB_00129726;
          if (uVar11 != 0) break;
          bVar12 = true;
          uVar11 = 0;
        }
        cVar1 = *state->source;
        bVar12 = cVar1 == '\r' || cVar1 == '\n';
      } while ((cVar1 == '\n') || (cVar1 == '\r'));
      pcVar13 = state->source + 1;
      state->source = pcVar13;
      uVar11 = uVar11 - 1;
      state->bytes_left = uVar11;
    } while (cVar1 != '>');
LAB_001295de:
    __src = state->token + 1;
    state->token = __src;
    lVar8 = -(((long)pcVar13 - (long)__src & 0xffffffffU) + 0xf & 0xfffffffffffffff0);
    fname = acStack_48 + lVar8;
    __n = (ulong)((int)((long)pcVar13 - (long)__src) - 1);
    *(undefined8 *)((long)auStack_60 + lVar8 + 0x10) = 0x12960e;
    memcpy(fname,__src,__n);
    fname[__n] = '\0';
    *(undefined8 *)((long)auStack_60 + lVar8 + 0x10) = 0x12961b;
    iVar10 = require_newline(state);
    if (iVar10 != 0) {
      local_40 = (char *)0x0;
      newdata._4_4_ = 0;
      p_Var2 = ctx->open_callback;
      if ((p_Var2 != (MOJOSHADER_includeOpen)0x0) &&
         (ctx->close_callback != (MOJOSHADER_includeClose)0x0)) {
        pcVar13 = state->source_base;
        p_Var3 = ctx->malloc;
        pvVar6 = ctx->malloc_data;
        *(MOJOSHADER_free *)((long)auStack_60 + lVar8 + 8) = ctx->free;
        *(void **)((long)auStack_60 + lVar8 + 0x10) = pvVar6;
        *(undefined8 *)((long)auStack_60 + lVar8) = 0x129674;
        iVar10 = (*p_Var2)(MVar14,fname,pcVar13,&local_40,(uint *)((long)&newdata + 4),p_Var3,
                           *(MOJOSHADER_free *)((long)auStack_60 + lVar8 + 8),
                           *(void **)((long)auStack_60 + lVar8 + 0x10));
        uVar11 = newdata._4_4_;
        pcVar13 = local_40;
        if (iVar10 == 0) {
          *(undefined8 *)((long)auStack_60 + lVar8 + 0x10) = 0x12975b;
          fail(ctx,"Include callback failed");
        }
        else {
          p_Var4 = ctx->close_callback;
          *(undefined8 *)((long)auStack_60 + lVar8 + 0x10) = 1;
          uVar7 = *(undefined8 *)((long)auStack_60 + lVar8 + 0x10);
          *(undefined8 *)((long)auStack_60 + lVar8 + 0x10) = 0x12969b;
          iVar10 = push_source(ctx,fname,pcVar13,uVar11,(uint)uVar7,p_Var4);
          pcVar13 = local_40;
          if (iVar10 == 0) {
            if (ctx->out_of_memory == 0) {
              *(code **)((long)auStack_60 + lVar8 + 0x10) = handle_pp_line;
              __assert_fail("ctx->out_of_memory",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_preprocessor.c"
                            ,0x33e,"void handle_pp_include(Context *)");
            }
            p_Var3 = ctx->malloc;
            p_Var5 = ctx->free;
            pvVar6 = ctx->malloc_data;
            p_Var4 = ctx->close_callback;
            *(undefined8 *)((long)auStack_60 + lVar8 + 0x10) = 0x1296cc;
            (*p_Var4)(pcVar13,p_Var3,p_Var5,pvVar6);
          }
        }
        return;
      }
      pcVar13 = "Saw #include, but no include callbacks defined";
      goto LAB_0012972d;
    }
  }
  else if (TVar9 == TOKEN_STRING_LITERAL) {
    pcVar13 = state->source;
    MVar14 = MOJOSHADER_INCLUDETYPE_LOCAL;
    goto LAB_001295de;
  }
LAB_00129726:
  pcVar13 = "Invalid #include directive";
LAB_0012972d:
  fail(ctx,pcVar13);
  return;
}

Assistant:

static void handle_pp_include(Context *ctx)
{
    IncludeState *state = ctx->include_stack;
    Token token = lexer(state);
    MOJOSHADER_includeType incltype;
    char *filename = NULL;
    int bogus = 0;

    if (token == TOKEN_STRING_LITERAL)
        incltype = MOJOSHADER_INCLUDETYPE_LOCAL;
    else if (token == ((Token) '<'))
    {
        incltype = MOJOSHADER_INCLUDETYPE_SYSTEM;
        // can't use lexer, since every byte between the < > pair is
        //  considered part of the filename.  :/
        while (!bogus)
        {
            if ( !(bogus = (state->bytes_left == 0)) )
            {
                const char ch = *state->source;
                if ( !(bogus = ((ch == '\r') || (ch == '\n'))) )
                {
                    state->source++;
                    state->bytes_left--;

                    if (ch == '>')
                        break;
                } // if
            } // if
        } // while
    } // else if
    else
    {
        bogus = 1;
    } // else

    if (!bogus)
    {
        state->token++;  // skip '<' or '\"'...
        const unsigned int len = ((unsigned int) (state->source-state->token));
        filename = (char *) alloca(len);
        memcpy(filename, state->token, len-1);
        filename[len-1] = '\0';
        bogus = !require_newline(state);
    } // if

    if (bogus)
    {
        fail(ctx, "Invalid #include directive");
        return;
    } // else

    const char *newdata = NULL;
    unsigned int newbytes = 0;
    if ((ctx->open_callback == NULL) || (ctx->close_callback == NULL))
    {
        fail(ctx, "Saw #include, but no include callbacks defined");
        return;
    } // if

    if (!ctx->open_callback(incltype, filename, state->source_base,
                            &newdata, &newbytes, ctx->malloc,
                            ctx->free, ctx->malloc_data))
    {
        fail(ctx, "Include callback failed");  // !!! FIXME: better error
        return;
    } // if

    MOJOSHADER_includeClose callback = ctx->close_callback;
    if (!push_source(ctx, filename, newdata, newbytes, 1, callback))
    {
        assert(ctx->out_of_memory);
        ctx->close_callback(newdata, ctx->malloc, ctx->free, ctx->malloc_data);
    } // if
}